

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_addlstring(luaL_Buffer *B,char *s,size_t l)

{
  size_t l_local;
  char *s_local;
  luaL_Buffer *B_local;
  
  if (0x2000U - ((long)B->p - (long)B->buffer) < l) {
    emptybuffer(B);
    lua_pushlstring(B->L,s,l);
    B->lvl = B->lvl + 1;
    adjuststack(B);
  }
  else {
    memcpy(B->p,s,l);
    B->p = B->p + l;
  }
  return;
}

Assistant:

LUALIB_API void luaL_addlstring(luaL_Buffer *B, const char *s, size_t l)
{
  if (l <= bufffree(B)) {
    memcpy(B->p, s, l);
    B->p += l;
  } else {
    emptybuffer(B);
    lua_pushlstring(B->L, s, l);
    B->lvl++;
    adjuststack(B);
  }
}